

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O3

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int(Value_type_to_xml *this,int val)

{
  char *tmp_finish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  string local_80;
  Node local_60 [2];
  char local_49;
  char *local_48;
  char *local_40;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_38;
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_48 = (char *)((long)&local_60[0].ctx + 2);
  local_38.m_value = -val;
  if (0 < val) {
    local_38.m_value = val;
  }
  local_38.m_czero = '0';
  local_38.m_zero = 0x30;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_40 = &local_49;
  local_38.m_finish = &local_49;
  local_48 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                       (&local_38);
  if (val < 0) {
    local_48[-1] = '-';
    local_48 = local_48 + -1;
  }
  local_40 = &local_49;
  std::__cxx11::string::replace
            ((ulong)&local_80,0,(char *)local_80._M_string_length,(ulong)local_48);
  XmlBuilder::Node::Node(local_60,this->builder_,"i4");
  XmlBuilder::Node::set_textdata(local_60,&local_80);
  XmlBuilder::Node::~Node(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int(int val)
{
  add_textnode("i4", boost::lexical_cast<std::string>(val));
}